

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQArray *this;
  SQUnsignedInteger SVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQObjectPtr *pSVar5;
  SQRESULT SVar6;
  SQUnsignedInteger nidx;
  SQObjectPtr res;
  SQObjectPtr other;
  SQObjectPtr local_40;
  
  nidx = 1;
  pSVar3 = stack_get(v,1);
  this = (pSVar3->super_SQObject)._unVal.pArray;
  SVar2 = (this->_values)._size;
  res.super_SQObject._type = OT_NULL;
  res.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar4 = sq_gettop(v);
  if (SVar4 < 3) {
    if (SVar2 == 0) {
      SVar4 = 0;
      goto LAB_001205fe;
    }
    SQArray::Get(this,0,&res);
  }
  else {
    pSVar5 = stack_get(v,3);
    SQObjectPtr::operator=(&res,pSVar5);
    nidx = 0;
  }
  if ((long)nidx < (long)SVar2) {
    other.super_SQObject._type = OT_NULL;
    other.super_SQObject._unVal.pTable = (SQTable *)0x0;
    pSVar5 = stack_get(v,2);
    SQVM::Push(v,pSVar5);
    SVar4 = -1;
    for (; SVar2 != nidx; nidx = nidx + 1) {
      SQArray::Get(this,nidx,&other);
      local_40.super_SQObject._type = (pSVar3->super_SQObject)._type;
      local_40.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
      if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SQVM::Push(v,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQVM::Push(v,&res);
      SQVM::Push(v,&other);
      SVar6 = sq_call(v,3,1,0);
      if (SVar6 < 0) {
        SQObjectPtr::~SQObjectPtr(&other);
        goto LAB_001205fe;
      }
      pSVar5 = SQVM::GetUp(v,-1);
      SQObjectPtr::operator=(&res,pSVar5);
      SQVM::Pop(v);
    }
    SQVM::Pop(v);
    SQObjectPtr::~SQObjectPtr(&other);
  }
  SQVM::Push(v,&res);
  SVar4 = 1;
LAB_001205fe:
  SQObjectPtr::~SQObjectPtr(&res);
  return SVar4;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr res;
    SQInteger iterStart;
    if (sq_gettop(v)>2) {
        res = stack_get(v,3);
        iterStart = 0;
    } else if (size==0) {
        return 0;
    } else {
        a->Get(0,res);
        iterStart = 1;
    }
    if (size > iterStart) {
        SQObjectPtr other;
        v->Push(stack_get(v,2));
        for (SQInteger n = iterStart; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
        v->Pop();
    }
    v->Push(res);
    return 1;
}